

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

bool __thiscall ParseNodeBlock::HasBlockScopedContent(ParseNodeBlock *this)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeBlock *pPVar3;
  ParseNodeCatch *pPVar4;
  ParseNodeWith *pPVar5;
  undefined4 *puVar6;
  ParseNode *local_20;
  ParseNodePtr pnode;
  ParseNodeBlock *this_local;
  
  if ((this->pnodeLexVars == (ParseNodePtr)0x0) && ((this->field_0x5c & 3) != 3)) {
    local_20 = this->pnodeScopes;
    while (local_20 != (ParseNode *)0x0) {
      switch(local_20->nop) {
      case knopFncDecl:
        return true;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x3145,"((0))","UNREACHED");
        if (bVar2) {
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
          return true;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      case knopBlock:
        pPVar3 = ParseNode::AsParseNodeBlock(local_20);
        local_20 = pPVar3->pnodeNext;
        break;
      case knopWith:
        pPVar5 = ParseNode::AsParseNodeWith(local_20);
        local_20 = pPVar5->pnodeNext;
        break;
      case knopCatch:
        pPVar4 = ParseNode::AsParseNodeCatch(local_20);
        local_20 = pPVar4->pnodeNext;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ParseNodeBlock::HasBlockScopedContent() const
{
    // A block has its own content if a let, const, or function is declared there.

    if (this->pnodeLexVars != nullptr || this->blockType == Parameter)
    {
        return true;
    }

    // The enclosing scopes can contain functions and other things, so walk the list
    // looking specifically for functions.

    for (ParseNodePtr pnode = this->pnodeScopes; pnode;)
    {
        switch (pnode->nop) {

        case knopFncDecl:
            return true;

        case knopBlock:
            pnode = pnode->AsParseNodeBlock()->pnodeNext;
            break;

        case knopCatch:
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;

        default:
            Assert(UNREACHED);
            return true;
        }
    }

    return false;
}